

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void uv__udp_recvmsg(uv_udp_t *handle)

{
  uv_udp_recv_cb p_Var1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  bool bVar5;
  uv_buf_t uVar6;
  sockaddr *local_100;
  sockaddr *addr;
  char *local_f0;
  int local_e8;
  uint local_e4;
  int count;
  int flags;
  uv_buf_t buf;
  ssize_t nread;
  msghdr h;
  sockaddr_storage peer;
  uv_udp_t *handle_local;
  
  if (handle->recv_cb == (uv_udp_recv_cb)0x0) {
    __assert_fail("handle->recv_cb != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/udp.c"
                  ,0xa0,"void uv__udp_recvmsg(uv_udp_t *)");
  }
  if (handle->alloc_cb != (uv_alloc_cb)0x0) {
    local_e8 = 0x20;
    memset(&nread,0,0x38);
    nread = (ssize_t)&h.msg_flags;
    do {
      uVar6 = uv_buf_init((char *)0x0,0);
      addr = (sockaddr *)uVar6.base;
      _count = addr;
      local_f0 = (char *)uVar6.len;
      buf.base = local_f0;
      (*handle->alloc_cb)((uv_handle_t *)handle,0x10000,(uv_buf_t *)&count);
      if ((_count == (sockaddr *)0x0) || (buf.base == (char *)0x0)) {
        (*handle->recv_cb)(handle,-0x69,(uv_buf_t *)&count,(sockaddr *)0x0,0);
        return;
      }
      if (_count == (sockaddr *)0x0) {
        __assert_fail("buf.base != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/udp.c"
                      ,0xb2,"void uv__udp_recvmsg(uv_udp_t *)");
      }
      h.msg_name._0_4_ = 0x80;
      h._8_8_ = &count;
      h.msg_iov = (iovec *)0x1;
      do {
        buf.len = recvmsg((handle->io_watcher).fd,(msghdr *)&nread,0);
        bVar5 = false;
        if (buf.len == 0xffffffffffffffff) {
          piVar4 = __errno_location();
          bVar5 = *piVar4 == 4;
        }
      } while (bVar5);
      if (buf.len == 0xffffffffffffffff) {
        piVar4 = __errno_location();
        if ((*piVar4 == 0xb) || (piVar4 = __errno_location(), *piVar4 == 0xb)) {
          (*handle->recv_cb)(handle,0,(uv_buf_t *)&count,(sockaddr *)0x0,0);
        }
        else {
          p_Var1 = handle->recv_cb;
          piVar4 = __errno_location();
          (*p_Var1)(handle,(long)-*piVar4,(uv_buf_t *)&count,(sockaddr *)0x0,0);
        }
      }
      else {
        if ((int)h.msg_name == 0) {
          local_100 = (sockaddr *)0x0;
        }
        else {
          local_100 = (sockaddr *)&h.msg_flags;
        }
        local_e4 = 0;
        if (((uint)h.msg_controllen & 0x20) != 0) {
          local_e4 = 2;
        }
        (*handle->recv_cb)(handle,buf.len,(uv_buf_t *)&count,local_100,local_e4);
      }
      bVar5 = false;
      if (buf.len != 0xffffffffffffffff) {
        iVar3 = local_e8 + -1;
        bVar5 = false;
        bVar2 = 0 < local_e8;
        local_e8 = iVar3;
        if ((bVar2) && (bVar5 = false, (handle->io_watcher).fd != -1)) {
          bVar5 = handle->recv_cb != (uv_udp_recv_cb)0x0;
        }
      }
    } while (bVar5);
    return;
  }
  __assert_fail("handle->alloc_cb != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/udp.c"
                ,0xa1,"void uv__udp_recvmsg(uv_udp_t *)");
}

Assistant:

static void uv__udp_recvmsg(uv_udp_t* handle) {
  struct sockaddr_storage peer;
  struct msghdr h;
  ssize_t nread;
  uv_buf_t buf;
  int flags;
  int count;

  assert(handle->recv_cb != NULL);
  assert(handle->alloc_cb != NULL);

  /* Prevent loop starvation when the data comes in as fast as (or faster than)
   * we can read it. XXX Need to rearm fd if we switch to edge-triggered I/O.
   */
  count = 32;

  memset(&h, 0, sizeof(h));
  h.msg_name = &peer;

  do {
    buf = uv_buf_init(NULL, 0);
    handle->alloc_cb((uv_handle_t*) handle, 64 * 1024, &buf);
    if (buf.base == NULL || buf.len == 0) {
      handle->recv_cb(handle, UV_ENOBUFS, &buf, NULL, 0);
      return;
    }
    assert(buf.base != NULL);

    h.msg_namelen = sizeof(peer);
    h.msg_iov = (void*) &buf;
    h.msg_iovlen = 1;

    do {
      nread = recvmsg(handle->io_watcher.fd, &h, 0);
    }
    while (nread == -1 && errno == EINTR);

    if (nread == -1) {
      if (errno == EAGAIN || errno == EWOULDBLOCK)
        handle->recv_cb(handle, 0, &buf, NULL, 0);
      else
        handle->recv_cb(handle, UV__ERR(errno), &buf, NULL, 0);
    }
    else {
      const struct sockaddr *addr;
      if (h.msg_namelen == 0)
        addr = NULL;
      else
        addr = (const struct sockaddr*) &peer;

      flags = 0;
      if (h.msg_flags & MSG_TRUNC)
        flags |= UV_UDP_PARTIAL;

      handle->recv_cb(handle, nread, &buf, addr, flags);
    }
  }
  /* recv_cb callback may decide to pause or close the handle */
  while (nread != -1
      && count-- > 0
      && handle->io_watcher.fd != -1
      && handle->recv_cb != NULL);
}